

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::NamedValueType::SerializeWithCachedSizes
          (NamedValueType *this,CodedOutputStream *output)

{
  bool bVar1;
  int size;
  long lVar2;
  char *data;
  string *value;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  NamedValueType *this_local;
  
  name_abi_cxx11_(this);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    name_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,"CoreML.Specification.MILSpec.NamedValueType.name");
    value = name_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,value,output);
  }
  bVar1 = has_type(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->type_->super_MessageLite,output);
  }
  return;
}

Assistant:

void NamedValueType::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.NamedValueType)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string name = 1;
  if (this->name().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MILSpec.NamedValueType.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // .CoreML.Specification.MILSpec.ValueType type = 2;
  if (this->has_type()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->type_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.NamedValueType)
}